

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O1

void finalize_regressor(vw *all,string *reg_name)

{
  size_type sVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (all->early_terminate == false) {
    sVar1 = (all->per_feature_regularizer_output)._M_string_length;
    if (sVar1 == 0) {
      paVar4 = &local_58.field_2;
      pcVar2 = (reg_name->_M_dataplus)._M_p;
      local_58._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + reg_name->_M_string_length);
      dump_regressor(all,&local_58,false);
      _Var3._M_p = local_58._M_dataplus._M_p;
    }
    else {
      paVar4 = &local_38.field_2;
      pcVar2 = (all->per_feature_regularizer_output)._M_dataplus._M_p;
      local_38._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>((string *)&local_38,pcVar2,pcVar2 + sVar1);
      dump_regressor(all,&local_38,false);
      _Var3._M_p = local_38._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar4) {
      operator_delete(_Var3._M_p);
    }
    sVar1 = (all->per_feature_regularizer_text)._M_string_length;
    if (sVar1 == 0) {
      pcVar2 = (all->text_regressor_name)._M_dataplus._M_p;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar2,pcVar2 + (all->text_regressor_name)._M_string_length);
      dump_regressor(all,&local_98,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      all->print_invert = true;
      pcVar2 = (all->inv_hash_regressor_name)._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar2,pcVar2 + (all->inv_hash_regressor_name)._M_string_length
                );
      dump_regressor(all,&local_b8,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      all->print_invert = false;
    }
    else {
      pcVar2 = (all->per_feature_regularizer_text)._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_78,pcVar2,pcVar2 + sVar1);
      dump_regressor(all,&local_78,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void finalize_regressor(vw& all, string reg_name)
{
  if (!all.early_terminate)
  {
    if (all.per_feature_regularizer_output.length() > 0)
      dump_regressor(all, all.per_feature_regularizer_output, false);
    else
      dump_regressor(all, reg_name, false);
    if (all.per_feature_regularizer_text.length() > 0)
      dump_regressor(all, all.per_feature_regularizer_text, true);
    else
    {
      dump_regressor(all, all.text_regressor_name, true);
      all.print_invert = true;
      dump_regressor(all, all.inv_hash_regressor_name, true);
      all.print_invert = false;
    }
  }
}